

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_int>::resetPool
          (btAxisSweep3Internal<unsigned_int> *this,btDispatcher *param_2)

{
  long in_RDI;
  uint i;
  undefined4 local_14;
  
  if (*(int *)(in_RDI + 0x40) == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 1;
    for (local_14 = *(uint *)(in_RDI + 0x50); local_14 < *(uint *)(in_RDI + 0x44);
        local_14 = local_14 + 1) {
      Handle::SetNextFree((Handle *)(*(long *)(in_RDI + 0x48) + (ulong)local_14 * 0x60),local_14 + 1
                         );
    }
    Handle::SetNextFree((Handle *)
                        (*(long *)(in_RDI + 0x48) + (ulong)(*(int *)(in_RDI + 0x44) - 1) * 0x60),0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::resetPool(btDispatcher* /*dispatcher*/)
{
	if (m_numHandles == 0)
	{
		m_firstFreeHandle = 1;
		{
			for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < m_maxHandles; i++)
				m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
			m_pHandles[m_maxHandles - 1].SetNextFree(0);
		}
	}
}